

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::Var::set_width_param(Var *this,Var *param)

{
  uint64_t uVar1;
  size_type *psVar2;
  undefined1 local_98 [8];
  ParamVisitor visitor;
  
  if (param == (Var *)0x0) {
    if (this->width_param_ != (Var *)0x0) {
      visitor.super_IRVisitor._8_8_ =
           &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
      visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
      visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
      visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
      visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
      visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
      local_98 = (undefined1  [8])&PTR_visit_root_002abda0;
      visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
           (__node_base_ptr)&visitor.params_._M_h._M_rehash_policy._M_next_resize;
      visitor.params_._M_h._M_buckets = (__buckets_ptr)0x1;
      visitor.params_._M_h._M_bucket_count = 0;
      visitor.params_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      visitor.params_._M_h._M_element_count._0_4_ = 0x3f800000;
      visitor.params_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      visitor.params_._M_h._M_rehash_policy._4_4_ = 0;
      visitor.params_._M_h._M_rehash_policy._M_next_resize = 0;
      IRVisitor::visit_root((IRVisitor *)local_98,&this->width_param_->super_IRNode);
      psVar2 = &visitor.params_._M_h._M_bucket_count;
      while (psVar2 = (size_type *)*psVar2, psVar2 != (size_type *)0x0) {
        Param::add_param_width_var((Param *)((__node_base *)(psVar2 + 1))->_M_nxt,this);
      }
      ParamVisitor::~ParamVisitor((ParamVisitor *)local_98);
    }
    this->width_param_ = (Var *)0x0;
  }
  else {
    uVar1 = Simulator::static_evaluate_expr(param);
    this->var_width_ = (uint32_t)uVar1;
    this->width_param_ = param;
    visitor.super_IRVisitor._8_8_ =
         &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
    visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
    visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
    local_98 = (undefined1  [8])&PTR_visit_root_002abda0;
    visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
         (__node_base_ptr)&visitor.params_._M_h._M_rehash_policy._M_next_resize;
    visitor.params_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.params_._M_h._M_bucket_count = 0;
    visitor.params_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.params_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.params_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.params_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.params_._M_h._M_rehash_policy._M_next_resize = 0;
    IRVisitor::visit_root((IRVisitor *)local_98,&param->super_IRNode);
    psVar2 = &visitor.params_._M_h._M_bucket_count;
    while (psVar2 = (size_type *)*psVar2, psVar2 != (size_type *)0x0) {
      Param::add_param_width_var((Param *)((__node_base *)(psVar2 + 1))->_M_nxt,this);
    }
    ParamVisitor::~ParamVisitor((ParamVisitor *)local_98);
  }
  return;
}

Assistant:

void Var::set_width_param(Var *param) {
    if (param == nullptr) {
        if (width_param_) {
            ParamVisitor visitor;
            visitor.visit_root(width_param_);
            auto const &params = visitor.params();
            for (const auto &p : params) {
                p->add_param_width_var(this);
            }
        }
        width_param_= nullptr;
        return;
    }
    // set width to the current param value
    auto value = Simulator::static_evaluate_expr(param);
    var_width_ = value;
    width_param_ = param;

    // get all the parameters
    ParamVisitor visitor;
    visitor.visit_root(param);
    auto const &params = visitor.params();
    for (const auto &p : params) {
        p->add_param_width_var(this);
    }
}